

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_vhost_foreach_listen_wsi(lws_context *cx,void *arg,lws_dll2_foreach_cb_t cb)

{
  int iVar1;
  lws_vhost *plStack_30;
  int n;
  lws_vhost *v;
  lws_dll2_foreach_cb_t cb_local;
  void *arg_local;
  lws_context *cx_local;
  
  plStack_30 = cx->vhost_list;
  while( true ) {
    if (plStack_30 == (lws_vhost *)0x0) {
      return 0;
    }
    iVar1 = lws_dll2_foreach_safe(&plStack_30->listen_wsi,arg,cb);
    if (iVar1 != 0) break;
    plStack_30 = plStack_30->vhost_next;
  }
  return iVar1;
}

Assistant:

int
lws_vhost_foreach_listen_wsi(struct lws_context *cx, void *arg,
			     lws_dll2_foreach_cb_t cb)
{
	struct lws_vhost *v = cx->vhost_list;
	int n;

	while (v) {

		n = lws_dll2_foreach_safe(&v->listen_wsi, arg, cb);
		if (n)
			return n;

		v = v->vhost_next;
	}

	return 0;
}